

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O3

QSize __thiscall QBoxLayout::maximumSize(QBoxLayout *this)

{
  uint uVar1;
  QBoxLayoutPrivate *this_00;
  ulong uVar2;
  ulong uVar3;
  
  this_00 = *(QBoxLayoutPrivate **)&(this->super_QLayout).field_0x8;
  if ((this_00->field_0x118 & 2) != 0) {
    QBoxLayoutPrivate::setupGeom(this_00);
  }
  uVar1 = (this_00->maxSize).wd.m_i;
  uVar2 = (ulong)uVar1;
  if (0x7fffe < (int)uVar1) {
    uVar2 = 0x7ffff;
  }
  uVar1 = (this_00->maxSize).ht.m_i;
  if (0x7fffe < (int)uVar1) {
    uVar1 = 0x7ffff;
  }
  uVar3 = (ulong)uVar1;
  uVar1 = (this->super_QLayout).super_QLayoutItem.align.
          super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i;
  if ((uVar1 & 0x1f) != 0) {
    uVar2 = 0x7ffff;
  }
  if ((uVar1 & 0x1e0) != 0) {
    uVar3 = 0x7ffff;
  }
  return (QSize)(uVar2 | uVar3 << 0x20);
}

Assistant:

QSize QBoxLayout::maximumSize() const
{
    Q_D(const QBoxLayout);
    if (d->dirty)
        const_cast<QBoxLayout*>(this)->d_func()->setupGeom();

    QSize s = d->maxSize.boundedTo(QSize(QLAYOUTSIZE_MAX, QLAYOUTSIZE_MAX));

    if (alignment() & Qt::AlignHorizontal_Mask)
        s.setWidth(QLAYOUTSIZE_MAX);
    if (alignment() & Qt::AlignVertical_Mask)
        s.setHeight(QLAYOUTSIZE_MAX);
    return s;
}